

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O1

void __thiscall AActor::RemoveFromHash(AActor *this)

{
  if ((this->tid != 0) && (this->iprev != (AActor **)0x0)) {
    *this->iprev = this->inext;
    if (this->inext != (AActor *)0x0) {
      this->inext->iprev = this->iprev;
    }
    this->inext = (AActor *)0x0;
    this->iprev = (AActor **)0x0;
  }
  this->tid = 0;
  return;
}

Assistant:

void AActor::RemoveFromHash ()
{
	if (tid != 0 && iprev)
	{
		*iprev = inext;
		if (inext)
		{
			inext->iprev = iprev;
		}
		iprev = NULL;
		inext = NULL;
	}
	tid = 0;
}